

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rand.cpp
# Opt level: O0

int __thiscall crnlib::random::irand_inclusive(random *this,int l,int h)

{
  int iVar1;
  int h_local;
  int l_local;
  random *this_local;
  
  iVar1 = irand(this,l,h + 1);
  return iVar1;
}

Assistant:

int random::irand_inclusive(int l, int h)
    {
        CRNLIB_ASSERT(h < cINT32_MAX);
        return irand(l, h + 1);
    }